

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxmlstream.cpp
# Opt level: O1

void __thiscall QXmlStreamReaderPrivate::resolveDtd(QXmlStreamReaderPrivate *this)

{
  NotationDeclaration *pNVar1;
  long *plVar2;
  EntityDeclaration *pEVar3;
  long lVar4;
  pointer pQVar5;
  pointer pQVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  QList<QXmlStreamNotationDeclaration>::resize
            (&this->publicNotationDeclarations,(this->notationDeclarations).tos + 1);
  if (-1 < (this->notationDeclarations).tos) {
    lVar8 = -1;
    lVar7 = 0x30;
    do {
      pNVar1 = (this->notationDeclarations).data;
      pQVar5 = QList<QXmlStreamNotationDeclaration>::data(&this->publicNotationDeclarations);
      plVar2 = *(long **)((long)pNVar1 + lVar7 + -0x30);
      if (plVar2 == (long *)0x0) {
        local_58.d = (Data *)0x0;
        local_58.ptr = (char16_t *)0x0;
        local_58.size = 0;
      }
      else {
        local_58.d = (Data *)*plVar2;
        lVar9 = plVar2[1];
        if ((QArrayData *)local_58.d != (QArrayData *)0x0) {
          LOCK();
          (((QArrayData *)local_58.d)->ref_)._q_value.super___atomic_base<int>._M_i =
               (((QArrayData *)local_58.d)->ref_)._q_value.super___atomic_base<int>._M_i + 1;
          UNLOCK();
        }
        local_58.size = *(qsizetype *)((long)pNVar1 + lVar7 + -0x20);
        local_58.ptr = (char16_t *)(lVar9 + *(long *)((long)pNVar1 + lVar7 + -0x28) * 2);
      }
      QArrayDataPointer<char16_t>::operator=
                ((QArrayDataPointer<char16_t> *)((long)pQVar5 + lVar7 + -0x30),&local_58);
      if (&(local_58.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_58.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_58.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_58.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_58.d)->super_QArrayData,2,0x10);
        }
      }
      plVar2 = *(long **)((long)&(pNVar1->name).m_string + lVar7);
      if (plVar2 == (long *)0x0) {
        local_58.d = (Data *)0x0;
        local_58.ptr = (char16_t *)0x0;
        local_58.size = 0;
      }
      else {
        local_58.d = (Data *)*plVar2;
        lVar9 = plVar2[1];
        if ((QArrayData *)local_58.d != (QArrayData *)0x0) {
          LOCK();
          (((QArrayData *)local_58.d)->ref_)._q_value.super___atomic_base<int>._M_i =
               (((QArrayData *)local_58.d)->ref_)._q_value.super___atomic_base<int>._M_i + 1;
          UNLOCK();
        }
        local_58.size = *(qsizetype *)((long)&(pNVar1->name).m_size + lVar7);
        local_58.ptr = (char16_t *)(lVar9 + *(long *)((long)&(pNVar1->name).m_pos + lVar7) * 2);
      }
      QArrayDataPointer<char16_t>::operator=
                ((QArrayDataPointer<char16_t> *)((long)pQVar5 + lVar7 + -0x18),&local_58);
      if (&(local_58.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_58.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_58.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_58.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_58.d)->super_QArrayData,2,0x10);
        }
      }
      plVar2 = *(long **)((long)pNVar1 + lVar7 + -0x18);
      if (plVar2 == (long *)0x0) {
        local_58.d = (Data *)0x0;
        local_58.ptr = (char16_t *)0x0;
        local_58.size = 0;
      }
      else {
        local_58.d = (Data *)*plVar2;
        lVar9 = plVar2[1];
        if ((QArrayData *)local_58.d != (QArrayData *)0x0) {
          LOCK();
          (((QArrayData *)local_58.d)->ref_)._q_value.super___atomic_base<int>._M_i =
               (((QArrayData *)local_58.d)->ref_)._q_value.super___atomic_base<int>._M_i + 1;
          UNLOCK();
        }
        local_58.size = *(qsizetype *)((long)pNVar1 + lVar7 + -8);
        local_58.ptr = (char16_t *)(lVar9 + *(long *)((long)pNVar1 + lVar7 + -0x10) * 2);
      }
      QArrayDataPointer<char16_t>::operator=
                ((QArrayDataPointer<char16_t> *)((long)&(pQVar5->m_name).m_string.d + lVar7),
                 &local_58);
      if (&(local_58.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_58.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_58.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_58.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_58.d)->super_QArrayData,2,0x10);
        }
      }
      lVar8 = lVar8 + 1;
      lVar7 = lVar7 + 0x48;
    } while (lVar8 < (this->notationDeclarations).tos);
  }
  (this->notationDeclarations).tos = -1;
  QList<QXmlStreamEntityDeclaration>::resize
            (&this->publicEntityDeclarations,(this->entityDeclarations).tos + 1);
  if (-1 < (this->entityDeclarations).tos) {
    lVar8 = -1;
    lVar7 = 0x70;
    lVar9 = 0;
    do {
      pEVar3 = (this->entityDeclarations).data;
      pQVar6 = QList<QXmlStreamEntityDeclaration>::data(&this->publicEntityDeclarations);
      plVar2 = *(long **)((long)pEVar3 + lVar7 + -0x70);
      if (plVar2 == (long *)0x0) {
        local_58.d = (Data *)0x0;
        local_58.ptr = (char16_t *)0x0;
        local_58.size = 0;
      }
      else {
        local_58.d = (Data *)*plVar2;
        lVar4 = plVar2[1];
        if ((QArrayData *)local_58.d != (QArrayData *)0x0) {
          LOCK();
          (((QArrayData *)local_58.d)->ref_)._q_value.super___atomic_base<int>._M_i =
               (((QArrayData *)local_58.d)->ref_)._q_value.super___atomic_base<int>._M_i + 1;
          UNLOCK();
        }
        local_58.size = *(qsizetype *)((long)pEVar3 + lVar7 + -0x60);
        local_58.ptr = (char16_t *)(lVar4 + *(long *)((long)pEVar3 + lVar7 + -0x68) * 2);
      }
      QArrayDataPointer<char16_t>::operator=
                ((QArrayDataPointer<char16_t> *)((long)&(pQVar6->m_name).m_string.d + lVar9),
                 &local_58);
      if (&(local_58.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_58.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_58.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_58.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_58.d)->super_QArrayData,2,0x10);
        }
      }
      plVar2 = *(long **)((long)pEVar3 + lVar7 + -0x58);
      if (plVar2 == (long *)0x0) {
        local_58.d = (Data *)0x0;
        local_58.ptr = (char16_t *)0x0;
        local_58.size = 0;
      }
      else {
        local_58.d = (Data *)*plVar2;
        lVar4 = plVar2[1];
        if ((QArrayData *)local_58.d != (QArrayData *)0x0) {
          LOCK();
          (((QArrayData *)local_58.d)->ref_)._q_value.super___atomic_base<int>._M_i =
               (((QArrayData *)local_58.d)->ref_)._q_value.super___atomic_base<int>._M_i + 1;
          UNLOCK();
        }
        local_58.size = *(qsizetype *)((long)pEVar3 + lVar7 + -0x48);
        local_58.ptr = (char16_t *)(lVar4 + *(long *)((long)pEVar3 + lVar7 + -0x50) * 2);
      }
      QArrayDataPointer<char16_t>::operator=
                ((QArrayDataPointer<char16_t> *)((long)&(pQVar6->m_notationName).m_string.d + lVar9)
                 ,&local_58);
      if (&(local_58.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_58.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_58.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_58.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_58.d)->super_QArrayData,2,0x10);
        }
      }
      plVar2 = *(long **)((long)pEVar3 + lVar7 + -0x28);
      if (plVar2 == (long *)0x0) {
        local_58.d = (Data *)0x0;
        local_58.ptr = (char16_t *)0x0;
        local_58.size = 0;
      }
      else {
        local_58.d = (Data *)*plVar2;
        lVar4 = plVar2[1];
        if ((QArrayData *)local_58.d != (QArrayData *)0x0) {
          LOCK();
          (((QArrayData *)local_58.d)->ref_)._q_value.super___atomic_base<int>._M_i =
               (((QArrayData *)local_58.d)->ref_)._q_value.super___atomic_base<int>._M_i + 1;
          UNLOCK();
        }
        local_58.size = *(qsizetype *)((long)pEVar3 + lVar7 + -0x18);
        local_58.ptr = (char16_t *)(lVar4 + *(long *)((long)pEVar3 + lVar7 + -0x20) * 2);
      }
      QArrayDataPointer<char16_t>::operator=
                ((QArrayDataPointer<char16_t> *)((long)&(pQVar6->m_systemId).m_string.d + lVar9),
                 &local_58);
      if (&(local_58.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_58.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_58.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_58.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_58.d)->super_QArrayData,2,0x10);
        }
      }
      plVar2 = *(long **)((long)pEVar3 + lVar7 + -0x40);
      if (plVar2 == (long *)0x0) {
        local_58.d = (Data *)0x0;
        local_58.ptr = (char16_t *)0x0;
        local_58.size = 0;
      }
      else {
        local_58.d = (Data *)*plVar2;
        lVar4 = plVar2[1];
        if ((QArrayData *)local_58.d != (QArrayData *)0x0) {
          LOCK();
          (((QArrayData *)local_58.d)->ref_)._q_value.super___atomic_base<int>._M_i =
               (((QArrayData *)local_58.d)->ref_)._q_value.super___atomic_base<int>._M_i + 1;
          UNLOCK();
        }
        local_58.size = *(qsizetype *)((long)pEVar3 + lVar7 + -0x30);
        local_58.ptr = (char16_t *)(lVar4 + *(long *)((long)pEVar3 + lVar7 + -0x38) * 2);
      }
      QArrayDataPointer<char16_t>::operator=
                ((QArrayDataPointer<char16_t> *)((long)&(pQVar6->m_publicId).m_string.d + lVar9),
                 &local_58);
      if (&(local_58.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_58.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_58.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_58.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_58.d)->super_QArrayData,2,0x10);
        }
      }
      plVar2 = *(long **)((long)pEVar3 + lVar7 + -0x10);
      if (plVar2 == (long *)0x0) {
        local_58.d = (Data *)0x0;
        local_58.ptr = (char16_t *)0x0;
        local_58.size = 0;
      }
      else {
        local_58.d = (Data *)*plVar2;
        lVar4 = plVar2[1];
        if ((QArrayData *)local_58.d != (QArrayData *)0x0) {
          LOCK();
          (((QArrayData *)local_58.d)->ref_)._q_value.super___atomic_base<int>._M_i =
               (((QArrayData *)local_58.d)->ref_)._q_value.super___atomic_base<int>._M_i + 1;
          UNLOCK();
        }
        local_58.size = *(qsizetype *)((long)&(pEVar3->name).m_string + lVar7);
        local_58.ptr = (char16_t *)(lVar4 + *(long *)((long)pEVar3 + lVar7 + -8) * 2);
      }
      QArrayDataPointer<char16_t>::operator=
                ((QArrayDataPointer<char16_t> *)((long)&(pQVar6->m_value).m_string.d + lVar9),
                 &local_58);
      if (&(local_58.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_58.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_58.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_58.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_58.d)->super_QArrayData,2,0x10);
        }
      }
      lVar8 = lVar8 + 1;
      lVar7 = lVar7 + 0x80;
      lVar9 = lVar9 + 0x78;
    } while (lVar8 < (this->entityDeclarations).tos);
  }
  (this->entityDeclarations).tos = -1;
  QHash<QStringView,_QXmlStreamReaderPrivate::Entity>::clear(&this->parameterEntityHash);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QXmlStreamReaderPrivate::resolveDtd()
{
    publicNotationDeclarations.resize(notationDeclarations.size());
    for (qsizetype i = 0; i < notationDeclarations.size(); ++i) {
        const QXmlStreamReaderPrivate::NotationDeclaration &notationDeclaration = notationDeclarations.at(i);
        QXmlStreamNotationDeclaration &publicNotationDeclaration = publicNotationDeclarations[i];
        publicNotationDeclaration.m_name = notationDeclaration.name;
        publicNotationDeclaration.m_systemId = notationDeclaration.systemId;
        publicNotationDeclaration.m_publicId = notationDeclaration.publicId;

    }
    notationDeclarations.clear();
    publicEntityDeclarations.resize(entityDeclarations.size());
    for (qsizetype i = 0; i < entityDeclarations.size(); ++i) {
        const QXmlStreamReaderPrivate::EntityDeclaration &entityDeclaration = entityDeclarations.at(i);
        QXmlStreamEntityDeclaration &publicEntityDeclaration = publicEntityDeclarations[i];
        publicEntityDeclaration.m_name = entityDeclaration.name;
        publicEntityDeclaration.m_notationName = entityDeclaration.notationName;
        publicEntityDeclaration.m_systemId = entityDeclaration.systemId;
        publicEntityDeclaration.m_publicId = entityDeclaration.publicId;
        publicEntityDeclaration.m_value = entityDeclaration.value;
    }
    entityDeclarations.clear();
    parameterEntityHash.clear();
}